

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O1

int AF_A_Look2(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  byte *pbVar1;
  VM_UBYTE VVar2;
  AActor *t1;
  undefined8 *puVar3;
  PClass *pPVar4;
  int iVar5;
  uint uVar6;
  undefined4 extraout_var;
  undefined8 uVar7;
  PClass *pPVar8;
  AActor *pAVar9;
  VMValue *pVVar10;
  FState *pFVar11;
  char *__assertion;
  AActor *t2;
  bool bVar12;
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_004f6735;
  }
  if (((param->field_0).field_3.Type != '\x03') ||
     (((param->field_0).field_1.atag != 1 && ((param->field_0).field_1.a != (void *)0x0)))) {
LAB_004f670a:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_004f6735:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                  ,0x88c,"int AF_A_Look2(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  t1 = (AActor *)(param->field_0).field_1.a;
  pVVar10 = param;
  uVar6 = numparam;
  if (t1 != (AActor *)0x0) {
    if ((t1->super_DThinker).super_DObject.Class == (PClass *)0x0) {
      iVar5 = (**(t1->super_DThinker).super_DObject._vptr_DObject)(t1);
      (t1->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar5);
    }
    pPVar8 = (t1->super_DThinker).super_DObject.Class;
    bVar12 = pPVar8 == (PClass *)0x0;
    ret = (VMReturn *)(ulong)!bVar12;
    uVar6 = (uint)bVar12;
    pVVar10 = (VMValue *)(ulong)(pPVar8 == pPVar4 || bVar12);
    if (pPVar8 != pPVar4 && !bVar12) {
      do {
        pPVar8 = pPVar8->ParentClass;
        ret = (VMReturn *)(ulong)(pPVar8 != (PClass *)0x0);
        if (pPVar8 == pPVar4) break;
      } while (pPVar8 != (PClass *)0x0);
    }
    if ((char)ret == '\0') {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_004f6735;
    }
  }
  pPVar4 = AActor::RegistrationInfo.MyClass;
  if ((numparam != 1) && (VVar2 = param[1].field_0.field_3.Type, VVar2 != 0xff)) {
    if ((VVar2 != '\x03') ||
       ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
    goto LAB_004f670a;
    puVar3 = (undefined8 *)param[1].field_0.field_1.a;
    if (puVar3 != (undefined8 *)0x0) {
      if (puVar3[1] == 0) {
        uVar7 = (**(code **)*puVar3)(puVar3,pVVar10,uVar6,ret);
        puVar3[1] = uVar7;
      }
      pPVar8 = (PClass *)puVar3[1];
      bVar12 = pPVar8 != (PClass *)0x0;
      if (pPVar8 != pPVar4 && bVar12) {
        do {
          pPVar8 = pPVar8->ParentClass;
          bVar12 = pPVar8 != (PClass *)0x0;
          if (pPVar8 == pPVar4) break;
        } while (pPVar8 != (PClass *)0x0);
      }
      if (!bVar12) {
        __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_004f6735;
      }
    }
  }
  if (((2 < numparam) && (VVar2 = param[2].field_0.field_3.Type, VVar2 != 0xff)) &&
     ((VVar2 != '\x03' ||
      ((param[2].field_0.field_1.atag != 8 && (param[2].field_0.field_1.a != (void *)0x0)))))) {
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
    goto LAB_004f6735;
  }
  if (((t1->flags5).Value & 0x20000000) != 0) {
    return 0;
  }
  t1->threshold = 0;
  pAVar9 = (t1->LastHeard).field_0.p;
  if ((pAVar9 != (AActor *)0x0) &&
     (((pAVar9->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
    (t1->LastHeard).field_0.p = (AActor *)0x0;
    pAVar9 = (AActor *)0x0;
  }
  t2 = (AActor *)0x0;
  if ((pAVar9 != (AActor *)0x0) && (0 < pAVar9->health)) {
    t2 = pAVar9;
  }
  if ((t2 != (AActor *)0x0) && (uVar6 = (t2->flags).Value, (uVar6 & 4) != 0)) {
    if (((level.flags._3_1_ & 0x20) == 0) && (((uVar6 ^ (t1->flags).Value) >> 0x1b & 1) == 0)) {
      bVar12 = P_LookForPlayers(t1,(t1->flags4).Value & 0x10000,(FLookExParams *)0x0);
      if (bVar12) {
        AActor::SetState(t1,t1->SeeState,false);
        pbVar1 = (byte *)((long)&(t1->flags4).Value + 1);
        *pbVar1 = *pbVar1 | 0x80;
        return 0;
      }
    }
    else if ((((t1->flags).Value & 0x20) == 0) || (bVar12 = P_CheckSight(t1,t2,4), bVar12)) {
      (t1->target).field_0.p = t2;
      t1->threshold = 10;
      pFVar11 = t1->SeeState;
      goto LAB_004f66f5;
    }
  }
  uVar6 = FRandom::GenRand32(&pr_look2);
  if ((uVar6 & 0xfe) < 0x1e) {
    pFVar11 = t1->SpawnState;
    uVar6 = FRandom::GenRand32(&pr_look2);
    AActor::SetState(t1,pFVar11 + (ulong)(uVar6 & 1) + 1,false);
  }
  if (((t1->flags4).Value & 0x20000) != 0) {
    return 0;
  }
  uVar6 = FRandom::GenRand32(&pr_look2);
  if (0x27 < (uVar6 & 0xf8)) {
    return 0;
  }
  pFVar11 = t1->SpawnState + 3;
LAB_004f66f5:
  AActor::SetState(t1,pFVar11,false);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Look2)
{
	PARAM_ACTION_PROLOGUE;

	AActor *targ;

	if (self->flags5 & MF5_INCONVERSATION)
		return 0;

	self->threshold = 0;
	targ = self->LastHeard;

	if (targ != NULL && targ->health <= 0)
	{
		targ = NULL;
	}

	if (targ && (targ->flags & MF_SHOOTABLE))
	{
		if ((level.flags & LEVEL_NOALLIES) ||
			(self->flags & MF_FRIENDLY) != (targ->flags & MF_FRIENDLY))
		{
			if (self->flags & MF_AMBUSH)
			{
				if (!P_CheckSight (self, targ, SF_SEEPASTBLOCKEVERYTHING))
					goto nosee;
			}
			self->target = targ;
			self->threshold = 10;
			self->SetState (self->SeeState);
			return 0;
		}
		else
		{
			if (!P_LookForPlayers (self, self->flags4 & MF4_LOOKALLAROUND, NULL))
				goto nosee;
			self->SetState (self->SeeState);
			self->flags4 |= MF4_INCOMBAT;
			return 0;
		}
	}
nosee:
	if (pr_look2() < 30)
	{
		self->SetState (self->SpawnState + (pr_look2() & 1) + 1);
	}
	if (!(self->flags4 & MF4_STANDSTILL) && pr_look2() < 40)
	{
		self->SetState (self->SpawnState + 3);
	}
	return 0;
}